

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

void helicsFederateClearUpdates(HelicsFederate fed)

{
  shared_ptr<helics::ValueFederate> fedObj;
  ValueFederate *local_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  
  getValueFedSharedPtr(&local_18,(HelicsError *)fed);
  if (local_18 != (ValueFederate *)0x0) {
    helics::ValueFederate::clearUpdates(local_18);
  }
  if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
  }
  return;
}

Assistant:

void helicsFederateClearUpdates(HelicsFederate fed)
{
    auto fedObj = getValueFedSharedPtr(fed, nullptr);
    if (!fedObj) {
        return;
    }
    try {
        fedObj->clearUpdates();
    }
    // LCOV_EXCL_START
    catch (...) {
        ;
    }
    // LCOV_EXCL_STOP
}